

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_strchr_internal.c
# Opt level: O1

char * host_strchr_internal(char *s,char *set,_Bool first)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  
  iVar4 = 0;
  pcVar3 = (char *)0x0;
  do {
    cVar1 = *s;
    if (cVar1 == '[') {
      iVar4 = iVar4 + 1;
    }
    else {
      if (cVar1 == '\0') {
        return pcVar3;
      }
      if (iVar4 < 1 || cVar1 != ']') {
        if ((iVar4 == 0) || (cVar1 != ':')) {
          pcVar2 = strchr(set,(int)cVar1);
          if (pcVar2 != (char *)0x0) {
            pcVar3 = s;
          }
          if (pcVar2 != (char *)0x0 && first) {
            return s;
          }
        }
      }
      else {
        iVar4 = iVar4 + -1;
      }
    }
    s = s + 1;
  } while( true );
}

Assistant:

const char *host_strchr_internal(const char *s, const char *set, bool first)
{
    int brackets = 0;
    const char *ret = NULL;

    while (1) {
        if (!*s)
            return ret;

        if (*s == '[')
            brackets++;
        else if (*s == ']' && brackets > 0)
            brackets--;
        else if (brackets && *s == ':')
            /* never match */ ;
        else if (strchr(set, *s)) {
            ret = s;
            if (first)
                return ret;
        }

        s++;
    }
}